

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void add_date(http_s *r)

{
  FIOBJ FVar1;
  size_t size;
  FIOBJ FVar2;
  FIOBJ FVar3;
  timespec tVar4;
  time_t local_78;
  time_t local_68;
  fio_str_info_s local_58;
  FIOBJ local_40;
  FIOBJ old;
  FIOBJ tmp;
  timespec local_20;
  http_s *local_10;
  http_s *r_local;
  
  local_10 = r;
  if (add_date::date_hash == 0) {
    add_date::date_hash = fiobj_hash_string("date",4);
  }
  if (add_date::mod_hash == 0) {
    add_date::mod_hash = fiobj_hash_string("last-modified",0xd);
  }
  local_20 = fio_last_tick();
  if (last_date_added < local_20.tv_sec) {
    fio_lock(&date_lock);
    _tmp = fio_last_tick();
    if (last_date_added < (long)tmp) {
      FVar1 = fiobj_str_buf(0x20);
      local_40 = current_date;
      old = FVar1;
      fiobj_obj2cstr(&local_58,FVar1);
      tVar4 = fio_last_tick();
      local_68 = tVar4.tv_sec;
      size = http_time2str(local_58.data,local_68);
      fiobj_str_resize(FVar1,size);
      tVar4 = fio_last_tick();
      local_78 = tVar4.tv_sec;
      last_date_added = local_78;
      current_date = old;
      fiobj_free(local_40);
    }
    fio_unlock(&date_lock);
  }
  FVar2 = fiobj_hash_get2((local_10->private_data).out_headers,add_date::date_hash);
  FVar1 = HTTP_HEADER_DATE;
  if (FVar2 == 0) {
    FVar2 = (local_10->private_data).out_headers;
    FVar3 = fiobj_dup(current_date);
    fiobj_hash_set(FVar2,FVar1,FVar3);
  }
  if (local_10->status_str == 0) {
    FVar2 = fiobj_hash_get2((local_10->private_data).out_headers,add_date::mod_hash);
    FVar1 = HTTP_HEADER_LAST_MODIFIED;
    if (FVar2 == 0) {
      FVar2 = (local_10->private_data).out_headers;
      FVar3 = fiobj_dup(current_date);
      fiobj_hash_set(FVar2,FVar1,FVar3);
    }
  }
  return;
}

Assistant:

static inline void add_date(http_s *r) {
  static uint64_t date_hash = 0;
  if (!date_hash)
    date_hash = fiobj_hash_string("date", 4);
  static uint64_t mod_hash = 0;
  if (!mod_hash)
    mod_hash = fiobj_hash_string("last-modified", 13);

  if (fio_last_tick().tv_sec > last_date_added) {
    fio_lock(&date_lock);
    if (fio_last_tick().tv_sec > last_date_added) { /* retest inside lock */
      FIOBJ tmp = fiobj_str_buf(32);
      FIOBJ old = current_date;
      fiobj_str_resize(
          tmp, http_time2str(fiobj_obj2cstr(tmp).data, fio_last_tick().tv_sec));
      last_date_added = fio_last_tick().tv_sec;
      current_date = tmp;
      fiobj_free(old);
    }
    fio_unlock(&date_lock);
  }

  if (!fiobj_hash_get2(r->private_data.out_headers, date_hash)) {
    fiobj_hash_set(r->private_data.out_headers, HTTP_HEADER_DATE,
                   fiobj_dup(current_date));
  }
  if (r->status_str == FIOBJ_INVALID &&
      !fiobj_hash_get2(r->private_data.out_headers, mod_hash)) {
    fiobj_hash_set(r->private_data.out_headers, HTTP_HEADER_LAST_MODIFIED,
                   fiobj_dup(current_date));
  }
}